

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_log(kvtree *hash,int log_level,int indent)

{
  kvtree_elem_struct *pkVar1;
  ulong uVar2;
  ulong uVar3;
  uint indent_00;
  char tmp [1024];
  char tmp_1 [1024];
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < indent) {
    uVar3 = (ulong)(uint)indent;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_838[uVar2] = 0x20;
  }
  local_838[indent] = 0;
  if (hash == (kvtree *)0x0) {
    kvtree_dbg(log_level,"%sNULL LIST\n",local_838);
  }
  else {
    indent_00 = indent + 2;
    uVar2 = 0;
    if (0 < (int)indent_00) {
      uVar2 = (ulong)indent_00;
    }
    while (pkVar1 = ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next,
          pkVar1 != (kvtree_elem_struct *)0x0) {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        local_438[uVar3] = 0x20;
      }
      local_438[(int)indent_00] = 0;
      if (pkVar1->key == (char *)0x0) {
        kvtree_dbg(log_level,"%sNULL KEY\n",local_438);
      }
      else {
        kvtree_dbg(log_level,"%s%s\n",local_438);
      }
      kvtree_log(pkVar1->hash,log_level,indent_00);
      hash = (kvtree *)&pkVar1->pointers;
    }
  }
  return 0;
}

Assistant:

int kvtree_log(const kvtree* hash, int log_level, int indent)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_log(elem, log_level, indent+2);
    }
  } else {
    kvtree_dbg(log_level, "%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}